

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# microui.c
# Opt level: O1

void pop_container(mu_Context *ctx)

{
  int iVar1;
  uint uVar2;
  char *pcVar3;
  mu_Container *pmVar4;
  _func_void_mu_Context_ptr_mu_Rect_int *p_Var5;
  code *pcVar6;
  long extraout_RDX;
  int iVar7;
  mu_Context *pmVar8;
  int iVar9;
  
  pmVar8 = ctx;
  pmVar4 = mu_get_current_container(ctx);
  iVar9 = (ctx->layout_stack).idx;
  p_Var5 = (_func_void_mu_Context_ptr_mu_Rect_int *)(long)iVar9;
  (pmVar4->content_size).x =
       (ctx->layout_stack).items[(long)(p_Var5 + -1)].max.x -
       *(int *)((long)&ctx->id_stack + (long)p_Var5 * 0x8c + -4);
  iVar7 = (ctx->layout_stack).items[(long)(p_Var5 + -1)].max.y -
          *(int *)((long)&ctx->id_stack + (long)p_Var5 * 0x8c);
  (pmVar4->content_size).y = iVar7;
  iVar1 = (ctx->container_stack).idx;
  if (iVar1 < 1) {
    pop_container_cold_1();
  }
  else {
    (ctx->container_stack).idx = iVar1 + -1;
    if (0 < iVar9) {
      (ctx->layout_stack).idx = iVar9 + -1;
      mu_pop_id(ctx);
      return;
    }
  }
  pop_container_cold_2();
  iVar9 = 0;
  if (1 < iVar7) {
    iVar9 = iVar7 + -1;
  }
  *(int *)&pmVar8->text_width = iVar9;
  pmVar8->text_height = (_func_int_mu_Font *)(extraout_RDX + (ulong)(1 < iVar7) * 8);
  pmVar8->draw_frame = p_Var5;
  (pmVar8->_style).font = (mu_Font)0x0;
  (pmVar8->_style).size.x = 0;
  (pmVar8->_style).size.y = 0;
  pcVar6 = p_Var5 + 8;
  while( true ) {
    pcVar3 = *(char **)(pcVar6 + -8);
    if ((pcVar3 == (char *)0x0) && (*(int *)pcVar6 == 0)) {
      return;
    }
    uVar2 = *(uint *)(pcVar6 + 0x10);
    if (((((ulong)uVar2 < 0x40) && ((0x8000080200000000U >> ((ulong)uVar2 & 0x3f) & 1) != 0)) ||
        (uVar2 == 0xffffffff)) || ((pcVar3 != (char *)0x0 && (*pcVar3 == '-')))) break;
    *(int *)&(pmVar8->_style).font = *(int *)&(pmVar8->_style).font + 1;
    pcVar6 = pcVar6 + 0x30;
  }
  return;
}

Assistant:

static void pop_container(mu_Context *ctx) {
  mu_Container *cnt = mu_get_current_container(ctx);
  mu_Layout *layout = get_layout(ctx);
  cnt->content_size.x = layout->max.x - layout->body.x;
  cnt->content_size.y = layout->max.y - layout->body.y;
  /* pop container, layout and id */
  pop(ctx->container_stack);
  pop(ctx->layout_stack);
  mu_pop_id(ctx);
}